

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall google::protobuf::FieldOptions::Clear(FieldOptions *this)

{
  uint32_t *puVar1;
  LogMessage *pLVar2;
  LogMessage local_58;
  Voidify local_45 [20];
  byte local_31;
  LogMessage local_30;
  Voidify local_1d;
  uint local_1c;
  FieldOptions *pFStack_18;
  uint32_t cached_has_bits;
  FieldOptions *this_local;
  
  this_local = (FieldOptions *)&this->field_0;
  local_1c = 0;
  pFStack_18 = this;
  internal::ExtensionSet::Clear(&(this->field_0)._impl_._extensions_);
  RepeatedField<int>::Clear(&(this->field_0)._impl_.targets_);
  RepeatedPtrField<google::protobuf::FieldOptions_EditionDefault>::Clear
            (&(this->field_0)._impl_.edition_defaults_);
  RepeatedPtrField<google::protobuf::UninterpretedOption>::Clear
            (&(this->field_0)._impl_.uninterpreted_option_);
  puVar1 = internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  local_1c = *puVar1;
  if ((local_1c & 3) != 0) {
    if ((local_1c & 1) != 0) {
      local_31 = 0;
      if ((this->field_0)._impl_.features_ == (FeatureSet *)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_30,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.cc"
                   ,0x27b8,"_impl_.features_ != nullptr");
        local_31 = 1;
        pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_30);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_1d,pLVar2);
      }
      if ((local_31 & 1) != 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_30);
      }
      FeatureSet::Clear((this->field_0)._impl_.features_);
    }
    if ((local_1c & 2) != 0) {
      if ((this->field_0)._impl_.feature_support_ == (FieldOptions_FeatureSupport *)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_58,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.cc"
                   ,0x27bc,"_impl_.feature_support_ != nullptr");
        pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_58);
        absl::lts_20250127::log_internal::Voidify::operator&&(local_45,pLVar2);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_58);
      }
      FieldOptions_FeatureSupport::Clear((this->field_0)._impl_.feature_support_);
    }
  }
  if ((local_1c & 0xfc) != 0) {
    memset((void *)((long)&this->field_0 + 0x70),0,0xc);
  }
  if ((local_1c & 0x700) != 0) {
    memset((void *)((long)&this->field_0 + 0x7c),0,8);
  }
  internal::HasBits<1>::Clear(&(this->field_0)._impl_._has_bits_);
  internal::InternalMetadata::Clear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void FieldOptions::Clear() {
// @@protoc_insertion_point(message_clear_start:google.protobuf.FieldOptions)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_._extensions_.Clear();
  _impl_.targets_.Clear();
  _impl_.edition_defaults_.Clear();
  _impl_.uninterpreted_option_.Clear();
  cached_has_bits = _impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000003u) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      ABSL_DCHECK(_impl_.features_ != nullptr);
      _impl_.features_->Clear();
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      ABSL_DCHECK(_impl_.feature_support_ != nullptr);
      _impl_.feature_support_->Clear();
    }
  }
  if ((cached_has_bits & 0x000000fcu) != 0) {
    ::memset(&_impl_.ctype_, 0, static_cast<::size_t>(
        reinterpret_cast<char*>(&_impl_.jstype_) -
        reinterpret_cast<char*>(&_impl_.ctype_)) + sizeof(_impl_.jstype_));
  }
  if ((cached_has_bits & 0x00000700u) != 0) {
    ::memset(&_impl_.unverified_lazy_, 0, static_cast<::size_t>(
        reinterpret_cast<char*>(&_impl_.retention_) -
        reinterpret_cast<char*>(&_impl_.unverified_lazy_)) + sizeof(_impl_.retention_));
  }
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}